

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,QPodPoint *p,QPodPoint *v1,QPodPoint *v2,QPodPoint *v3)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  QPodPoint *in_R8;
  bool leftOfNextEdge;
  bool leftOfPreviousEdge;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_1;
  
  bVar2 = qPointIsLeftOfLine(in_R8,(QPodPoint *)
                                   CONCAT17(in_stack_ffffffffffffffcf,
                                            CONCAT16(in_stack_ffffffffffffffce,
                                                     CONCAT15(in_stack_ffffffffffffffcd,
                                                              CONCAT14(in_stack_ffffffffffffffcc,
                                                                       in_stack_ffffffffffffffc8))))
                             ,(QPodPoint *)0x685305);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  bVar2 = qPointIsLeftOfLine(in_R8,(QPodPoint *)
                                   ((CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffce,
                                                             CONCAT15(in_stack_ffffffffffffffcd,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8)))) ^ 0xff00000000000000
                                    ) & 0x1ffffffffffffff),(QPodPoint *)0x685321);
  bVar4 = (bVar2 ^ 0xffU) & 1;
  bVar2 = qPointIsLeftOfLine(in_R8,(QPodPoint *)
                                   ((CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)))) ^
                                    0xff000000000000) & 0xff01ffffffffffff),(QPodPoint *)0x68533d);
  if (bVar2) {
    bVar1 = 0;
    if ((bVar3 & 1) != 0) {
      bVar1 = bVar4;
    }
  }
  else {
    bVar1 = 1;
    if ((bVar3 & 1) == 0) {
      bVar1 = bVar4;
    }
  }
  local_1 = (bool)(bVar1 & 1);
  return local_1;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(const QPodPoint &p, const QPodPoint &v1, const QPodPoint &v2, const QPodPoint &v3)
{
    bool leftOfPreviousEdge = !qPointIsLeftOfLine(p, v2, v1);
    bool leftOfNextEdge = !qPointIsLeftOfLine(p, v3, v2);

    if (qPointIsLeftOfLine(v1, v2, v3))
        return leftOfPreviousEdge && leftOfNextEdge;
    else
        return leftOfPreviousEdge || leftOfNextEdge;
}